

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O1

void init_attr(int np)

{
  schar *psVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  xchar xVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  
  u.acurr.a._4_2_ = urole.attrbase._4_2_;
  u.acurr.a._0_4_ = urole.attrbase._0_4_;
  lVar6 = -6;
  do {
    cVar2 = urole.attrdist[lVar6];
    u.atemp.a[lVar6] = cVar2;
    *(undefined1 *)((long)(&u.atime + 1) + lVar6) = 0;
    u.atime.a[lVar6] = '\0';
    np = np - cVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  bVar12 = 0 < np;
  if (0 < np) {
    do {
      uVar10 = 0;
LAB_0014ff04:
      do {
        uVar3 = mt_random();
        uVar9 = 0;
        uVar3 = uVar3 % 100;
        do {
          uVar4 = uVar3 - (int)urole.attrdist[uVar9];
          if (uVar4 == 0 || (int)uVar3 < (int)urole.attrdist[uVar9]) goto LAB_0014ff38;
          uVar9 = uVar9 + 1;
          uVar3 = uVar4;
        } while (uVar9 != 6);
        uVar9 = 6;
LAB_0014ff38:
      } while (5 < (uint)uVar9);
      uVar7 = uVar9 & 0xffffffff;
      cVar2 = u.acurr.a[uVar7];
      if ((((uint)uVar9 != 0) || (u.umonnum == u.umonster)) ||
         (xVar8 = 'v', ((youmonst.data)->mflags2 & 0x4000000) == 0)) {
        xVar8 = urace.attrmax[uVar7];
      }
      if (xVar8 <= cVar2) {
        bVar11 = uVar10 < 99;
        uVar10 = uVar10 + 1;
        if (!(bool)(bVar11 & bVar12)) goto LAB_0014ffbf;
        goto LAB_0014ff04;
      }
      u.acurr.a[uVar7] = cVar2 + '\x01';
      psVar1 = u.amax.a + uVar7;
      *psVar1 = *psVar1 + '\x01';
      bVar12 = 1 < np;
      bVar11 = 1 < np;
      np = np - 1;
    } while (bVar11);
    np = 0;
  }
LAB_0014ffbf:
  if (np < 0) {
    uVar10 = (uint)np >> 0x1f;
    do {
      uVar3 = 0;
LAB_0014ffe1:
      do {
        uVar4 = mt_random();
        uVar9 = 0;
        uVar4 = uVar4 % 100;
        do {
          uVar5 = uVar4 - (int)urole.attrdist[uVar9];
          if (uVar5 == 0 || (int)uVar4 < (int)urole.attrdist[uVar9]) goto LAB_00150015;
          uVar9 = uVar9 + 1;
          uVar4 = uVar5;
        } while (uVar9 != 6);
        uVar9 = 6;
LAB_00150015:
      } while (5 < (uint)uVar9);
      uVar9 = uVar9 & 0xffffffff;
      cVar2 = u.acurr.a[uVar9];
      if (cVar2 <= urace.attrmin[uVar9]) {
        bVar12 = uVar3 < 99;
        uVar3 = uVar3 + 1;
        if ((bVar12 & (byte)uVar10) != 1) {
          return;
        }
        goto LAB_0014ffe1;
      }
      u.acurr.a[uVar9] = cVar2 + -1;
      psVar1 = u.amax.a + uVar9;
      *psVar1 = *psVar1 + -1;
      uVar10 = (uint)(np < -1);
      np = np + 1;
    } while (np != 0);
  }
  return;
}

Assistant:

void init_attr(int np)
{
	int	i, x, tryct;


	for (i = 0; i < A_MAX; i++) {
	    ABASE(i) = AMAX(i) = urole.attrbase[i];
	    ATEMP(i) = ATIME(i) = 0;
	    np -= urole.attrbase[i];
	}

	tryct = 0;
	while (np > 0 && tryct < 100) {

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) >= ATTRMAX(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)++;
	    AMAX(i)++;
	    np--;
	}

	tryct = 0;
	while (np < 0 && tryct < 100) {		/* for redistribution */

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) <= ATTRMIN(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)--;
	    AMAX(i)--;
	    np++;
	}
}